

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::DistributeProbability
          (BayesianGameCollaborativeGraphical *this,Index jtI,double p)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  uint LRF;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  BayesianGameBase::SetProbability((BayesianGameBase *)this,jtI,p);
  indivIndices = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this,jtI);
  for (LRF = 0; (ulong)LRF < this->_m_nrLRFs; LRF = LRF + 1) {
    RestrictIndividualIndicesToScope<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,this,indivIndices,
               LRF);
    BayesianGameBase::AddProbability
              ((BayesianGameBase *)
               (this->_m_LRFs).
               super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
               ._M_impl.super__Vector_impl_data._M_start[LRF],
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,p);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  }
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::DistributeProbability(Index jtI, double p)
{
    //set the probability of the joint type (represented by the 
    //BayesianGameBase )
    BayesianGameBase::SetProbability(jtI, p);

    //for each LRF add p to the consistent vars.
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    
    for(Index e = 0; e < _m_nrLRFs; e++)
    {    
        vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);
        //now we have a smaller vector with the individual types restricted
        //to the agent in the scope of e
        _m_LRFs[e]->AddProbability(restrictedIndivTypes, p);
    }

}